

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_half_float_linear(void *outputp,int width_times_channels,float *encode)

{
  stbir__FP16 sVar1;
  stbir__FP16 *psVar2;
  int in_ESI;
  stbir__FP16 *in_RDI;
  bool bVar3;
  float *end_encode_m8;
  stbir__FP16 *end_output;
  stbir__FP16 *output;
  float *in_stack_000000b0;
  void *in_stack_000000b8;
  undefined8 in_stack_ffffffffffffffd0;
  stbir__FP16 *local_20;
  
  psVar2 = in_RDI + in_ESI;
  if (in_ESI < 8) {
    for (local_20 = in_RDI + 4; local_20 <= psVar2; local_20 = local_20 + 4) {
      sVar1 = stbir__float_to_half((float)in_stack_ffffffffffffffd0);
      local_20[-4] = sVar1;
      sVar1 = stbir__float_to_half((float)in_stack_ffffffffffffffd0);
      local_20[-3] = sVar1;
      sVar1 = stbir__float_to_half((float)in_stack_ffffffffffffffd0);
      local_20[-2] = sVar1;
      sVar1 = stbir__float_to_half((float)in_stack_ffffffffffffffd0);
      local_20[-1] = sVar1;
    }
    for (local_20 = local_20 + -4; local_20 < psVar2; local_20 = local_20 + 1) {
      sVar1 = stbir__float_to_half((float)in_stack_ffffffffffffffd0);
      *local_20 = sVar1;
    }
  }
  else {
    local_20 = in_RDI;
    do {
      do {
        stbir__float_to_half_SIMD(in_stack_000000b8,in_stack_000000b0);
        local_20 = local_20 + 8;
      } while (local_20 <= psVar2 + -8);
      bVar3 = local_20 != psVar2;
      local_20 = psVar2 + -8;
    } while (bVar3);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}